

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BindContext::CreateColumnReference
          (BindContext *this,string *catalog_name,string *schema_name,string *table_name,
          string *column_name,ColumnBindType bind_type)

{
  value_type *__x;
  bool bVar1;
  int iVar2;
  Binding *pBVar3;
  LogicalIndex idx;
  TableBinding *pTVar4;
  undefined4 extraout_var;
  TableCatalogEntry *this_00;
  ColumnDefinition *this_01;
  reference __lhs;
  pointer pCVar5;
  LogicalIndex table_binding;
  undefined4 in_register_0000008c;
  optional_ptr<duckdb::Binding,_true> binding;
  int in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  optional_ptr<duckdb::StandardEntry,_true> catalog_entry;
  BindingAlias alias;
  ErrorData error;
  optional_ptr<duckdb::Binding,_true> local_1a8;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_198;
  optional_ptr<duckdb::StandardEntry,_true> local_178;
  string local_170;
  string local_150;
  string local_130;
  BindingAlias local_110;
  ErrorData local_b0;
  
  __x = (value_type *)CONCAT44(in_register_0000008c,bind_type);
  ErrorData::ErrorData(&local_b0);
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (schema_name->_M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198,schema_name);
  }
  if (table_name->_M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198,table_name);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_198,column_name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_198,__x);
  ::std::__cxx11::string::string((string *)&local_130,(string *)schema_name);
  ::std::__cxx11::string::string((string *)&local_150,(string *)table_name);
  ::std::__cxx11::string::string((string *)&local_170,(string *)column_name);
  BindingAlias::BindingAlias(&local_110,&local_130,&local_150,&local_170);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_130);
  make_uniq<duckdb::ColumnRefExpression,duckdb::vector<std::__cxx11::string,true>>
            ((duckdb *)&local_1a0,&local_198);
  local_1a8 = GetBinding((BindContext *)catalog_name,&local_110,__x,&local_b0);
  if (local_1a8.ptr != (Binding *)0x0) {
    pBVar3 = optional_ptr<duckdb::Binding,_true>::operator->(&local_1a8);
    idx.index = Binding::GetBindingIndex(pBVar3,__x);
    if (in_stack_00000008 == 0) {
      pBVar3 = optional_ptr<duckdb::Binding,_true>::operator*(&local_1a8);
      if (pBVar3->binding_type == TABLE) {
        pTVar4 = Binding::Cast<duckdb::TableBinding>(pBVar3);
        iVar2 = (*(pTVar4->super_Binding)._vptr_Binding[4])(pTVar4);
        local_178.ptr = (StandardEntry *)CONCAT44(extraout_var,iVar2);
        if (local_178.ptr != (StandardEntry *)0x0) {
          bVar1 = IsVirtualColumn(idx.index);
          if (!bVar1) {
            this_00 = (TableCatalogEntry *)
                      optional_ptr<duckdb::StandardEntry,_true>::operator->(&local_178);
            table_binding.index = idx.index;
            this_01 = TableCatalogEntry::GetColumn(this_00,idx);
            bVar1 = ColumnDefinition::Generated(this_01);
            if (bVar1) {
              pBVar3 = optional_ptr<duckdb::Binding,_true>::operator->(&local_1a8);
              pTVar4 = Binding::Cast<duckdb::TableBinding>(pBVar3);
              ExpandGeneratedColumn(this,(TableBinding *)table_binding.index,(string *)pTVar4);
              if (local_1a0._M_head_impl != (ColumnRefExpression *)0x0) {
                (*(code *)((__node_base_ptr)
                          ((local_1a0._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                          _vptr_BaseExpression)[1]._M_nxt)();
              }
              goto LAB_0130f74b;
            }
          }
        }
      }
    }
    pBVar3 = optional_ptr<duckdb::Binding,_true>::operator->(&local_1a8);
    if (idx.index <
        (ulong)((long)(pBVar3->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar3->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      pBVar3 = optional_ptr<duckdb::Binding,_true>::operator->(&local_1a8);
      __lhs = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(&pBVar3->names,idx.index);
      bVar1 = ::std::operator!=(__lhs,__x);
      if (bVar1) {
        pCVar5 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                               *)&local_1a0);
        pBVar3 = optional_ptr<duckdb::Binding,_true>::operator->(&local_1a8);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::get<true>(&pBVar3->names,idx.index);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pCVar5->super_ParsedExpression).super_BaseExpression.alias);
      }
    }
  }
  (this->cte_references)._M_h._M_buckets = (__buckets_ptr)local_1a0._M_head_impl;
LAB_0130f74b:
  BindingAlias::~BindingAlias(&local_110);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_198);
  ErrorData::~ErrorData(&local_b0);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> BindContext::CreateColumnReference(const string &catalog_name, const string &schema_name,
                                                                const string &table_name, const string &column_name,
                                                                ColumnBindType bind_type) {
	ErrorData error;
	vector<string> names;
	if (!catalog_name.empty()) {
		names.push_back(catalog_name);
	}
	if (!schema_name.empty()) {
		names.push_back(schema_name);
	}
	names.push_back(table_name);
	names.push_back(column_name);

	BindingAlias alias(catalog_name, schema_name, table_name);
	auto result = make_uniq<ColumnRefExpression>(std::move(names));
	auto binding = GetBinding(alias, column_name, error);
	if (!binding) {
		return std::move(result);
	}
	auto column_index = binding->GetBindingIndex(column_name);
	if (bind_type == ColumnBindType::EXPAND_GENERATED_COLUMNS && ColumnIsGenerated(*binding, column_index)) {
		return ExpandGeneratedColumn(binding->Cast<TableBinding>(), column_name);
	} else if (column_index < binding->names.size() && binding->names[column_index] != column_name) {
		// because of case insensitivity in the binder we rename the column to the original name
		// as it appears in the binding itself
		result->SetAlias(binding->names[column_index]);
	}
	return std::move(result);
}